

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

uint32_t gravity_list_size(gravity_vm *vm,gravity_list_t *list)

{
  gravity_value_t *pgVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 obj;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  gravity_value_t v;
  
  (list->gc).visited = true;
  sVar5 = (list->array).n;
  if (sVar5 == 0) {
    uVar3 = 0x48;
  }
  else {
    iVar4 = 0;
    lVar6 = 8;
    do {
      pgVar1 = (list->array).p;
      obj = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
            ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&pgVar1->isa + lVar6))->p;
      v.field_1.p = (gravity_object_t *)obj.n;
      v.isa = *(gravity_class_t **)((long)pgVar1 + lVar6 + -8);
      _Var2 = gravity_value_isobject(v);
      uVar3 = 0;
      if (_Var2) {
        uVar3 = gravity_object_size(vm,obj.p);
      }
      iVar4 = iVar4 + uVar3;
      lVar6 = lVar6 + 0x10;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    uVar3 = iVar4 + 0x48;
  }
  (list->gc).visited = false;
  return uVar3;
}

Assistant:

uint32_t gravity_list_size (gravity_vm *vm, gravity_list_t *list) {
    SET_OBJECT_VISITED_FLAG(list, true);
    
    uint32_t internal_size = 0;
    size_t count = marray_size(list->array);
    for (size_t i=0; i<count; ++i) {
        internal_size += gravity_value_size(vm, marray_get(list->array, i));
    }
    internal_size += sizeof(gravity_list_t);
    
    SET_OBJECT_VISITED_FLAG(list, false);
    return internal_size;
}